

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl_tree.c
# Opt level: O1

NodeAVL * avlRemoveMin(NodeAVL *p)

{
  NodeAVL *pNVar1;
  
  if (p->left != (NodeAVL *)0x0) {
    pNVar1 = avlRemoveMin(p->left);
    p->left = pNVar1;
    pNVar1 = avlBalance(p);
    return pNVar1;
  }
  return p->right;
}

Assistant:

static
NodeAVL* avlRemoveMin( NodeAVL* p ){
    #ifdef DEBUG_AVL
      printf( "avlRemoveMin id=%d\n", p->id );
    #endif
    if( !p->left ) return p->right;
    p->left = avlRemoveMin( p->left );
    #ifdef DEBUG_AVL
      printf( "bude balance z avlRemoveMin id=%d\n", p->id );
    #endif
    return avlBalance( p );
}